

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubwordLearner.cc
# Opt level: O0

void __thiscall onmt::SubwordLearner::ingest(SubwordLearner *this,string *text,Tokenizer *tokenizer)

{
  bool bVar1;
  element_type *in_RDX;
  string *in_RDI;
  Token *token;
  iterator __end1;
  iterator __begin1;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *__range1;
  vector<onmt::Token,_std::allocator<onmt::Token>_> tokens;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *annotated_tokens;
  Tokenizer *in_stack_ffffffffffffffa0;
  __normal_iterator<onmt::Token_*,_std::vector<onmt::Token,_std::allocator<onmt::Token>_>_> local_50
  ;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *local_48;
  vector<onmt::Token,_std::allocator<onmt::Token>_> local_30;
  element_type *local_18;
  
  local_18 = in_RDX;
  if (in_RDX == (element_type *)0x0) {
    local_18 = std::__shared_ptr<const_onmt::Tokenizer,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<const_onmt::Tokenizer,_(__gnu_cxx::_Lock_policy)2> *)
                          &in_RDI->field_2);
  }
  annotated_tokens = &local_30;
  std::vector<onmt::Token,_std::allocator<onmt::Token>_>::vector
            ((vector<onmt::Token,_std::allocator<onmt::Token>_> *)0x3c0897);
  Tokenizer::tokenize(in_stack_ffffffffffffffa0,in_RDI,annotated_tokens,
                      (bool)in_stack_ffffffffffffff8f);
  local_48 = &local_30;
  local_50._M_current =
       (Token *)std::vector<onmt::Token,_std::allocator<onmt::Token>_>::begin
                          ((vector<onmt::Token,_std::allocator<onmt::Token>_> *)
                           CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  std::vector<onmt::Token,_std::allocator<onmt::Token>_>::end
            ((vector<onmt::Token,_std::allocator<onmt::Token>_> *)
             CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<onmt::Token_*,_std::vector<onmt::Token,_std::allocator<onmt::Token>_>_>
                        *)annotated_tokens,
                       (__normal_iterator<onmt::Token_*,_std::vector<onmt::Token,_std::allocator<onmt::Token>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    if (!bVar1) break;
    in_stack_ffffffffffffffa0 =
         (Tokenizer *)
         __gnu_cxx::
         __normal_iterator<onmt::Token_*,_std::vector<onmt::Token,_std::allocator<onmt::Token>_>_>::
         operator*(&local_50);
    (**(code **)(*(long *)in_RDI + 0x10))(in_RDI,in_stack_ffffffffffffffa0);
    __gnu_cxx::
    __normal_iterator<onmt::Token_*,_std::vector<onmt::Token,_std::allocator<onmt::Token>_>_>::
    operator++(&local_50);
  }
  std::vector<onmt::Token,_std::allocator<onmt::Token>_>::~vector
            ((vector<onmt::Token,_std::allocator<onmt::Token>_> *)in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void SubwordLearner::ingest(const std::string& text, const Tokenizer* tokenizer)
  {
    if (!tokenizer)
      tokenizer = _default_tokenizer.get();

    std::vector<Token> tokens;
    tokenizer->tokenize(text, tokens);
    for (const auto& token : tokens)
      ingest_token(token);
  }